

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  FunctionData *pFVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  double *local_f0;
  AggregateUnaryInput local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_c0.input_mask = (ValidityMask *)(input + 0x28);
      local_c0.input_idx = 0;
      local_c0.input = aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<double>>::
      ConstantOperation<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                ((ModeState<double,_duckdb::ModeStandard<double>_> *)
                 **(undefined8 **)(states + 0x20),*(double **)(input + 0x20),&local_c0,count);
    }
  }
  else if (*input == (Vector)0x0 && *states == (Vector)0x0) {
    local_f0 = *(double **)(input + 0x20);
    lVar1 = *(long *)(states + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (*(long *)(input + 0x28) == 0) {
      if (count != 0) {
        iVar5 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<double>>::
          Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                    (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(lVar1 + iVar5 * 8),
                     local_f0,aggr_input_data);
          iVar5 = iVar5 + 1;
          local_f0 = local_f0 + 1;
        } while (count != iVar5);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = *(ulong *)(*(long *)(input + 0x28) + uVar3 * 8);
        }
        uVar8 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar6 != 0) {
          uVar9 = uVar4;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar4 < uVar8) {
              pdVar7 = local_f0 + uVar4;
              do {
                BaseModeFunction<duckdb::ModeStandard<double>>::
                Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                          (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(lVar1 + uVar4 * 8)
                           ,pdVar7,aggr_input_data);
                uVar4 = uVar4 + 1;
                pdVar7 = pdVar7 + 1;
                uVar9 = uVar4;
              } while (uVar8 != uVar4);
            }
          }
          else if (uVar4 < uVar8) {
            pdVar7 = local_f0 + uVar4;
            uVar9 = 0;
            do {
              if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<double>>::
                Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                          (*(ModeState<double,_duckdb::ModeStandard<double>_> **)
                            (lVar1 + uVar4 * 8 + uVar9 * 8),pdVar7,aggr_input_data);
              }
              uVar9 = uVar9 + 1;
              pdVar7 = pdVar7 + 1;
            } while ((uVar4 - uVar8) + uVar9 != 0);
            uVar9 = uVar4 + uVar9;
          }
        }
        uVar3 = uVar3 + 1;
        uVar4 = uVar9;
      } while (uVar3 != count + 0x3f >> 6);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_c0.input_idx == 0) {
      if (count != 0) {
        uVar4 = 0;
        do {
          pFVar2 = ((local_c0.input)->bind_data).ptr;
          uVar3 = uVar4;
          if (pFVar2 != (FunctionData *)0x0) {
            uVar3 = (ulong)*(uint *)(pFVar2 + uVar4 * 4);
          }
          uVar6 = uVar4;
          if (*local_78 != 0) {
            uVar6 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
          }
          BaseModeFunction<duckdb::ModeStandard<double>>::
          Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                    (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(local_70 + uVar6 * 8),
                     (double *)
                     (&((local_c0.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                       validity_mask + uVar3),aggr_input_data);
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
    }
    else if (count != 0) {
      uVar4 = 0;
      do {
        pFVar2 = ((local_c0.input)->bind_data).ptr;
        uVar3 = uVar4;
        if (pFVar2 != (FunctionData *)0x0) {
          uVar3 = (ulong)*(uint *)(pFVar2 + uVar4 * 4);
        }
        uVar6 = uVar4;
        if (*local_78 != 0) {
          uVar6 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
        }
        if ((local_c0.input_idx == 0) ||
           ((*(ulong *)(local_c0.input_idx + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<double>>::
          Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                    (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(local_70 + uVar6 * 8),
                     (double *)
                     (&((local_c0.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                       validity_mask + uVar3),aggr_input_data);
        }
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}